

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffDistTest2<unsigned_long,Blob<224>>(pfHash hash,bool drawDiagram)

{
  pointer pBVar1;
  undefined1 auVar2 [32];
  bool bVar3;
  int keybit;
  uint bit;
  bool bVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar8 [32];
  Blob<224> t;
  unsigned_long k;
  Blob<224> h1;
  Blob<224> h2;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_d0;
  undefined1 local_b8 [32];
  Rand local_98;
  undefined1 local_80 [8];
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined4 uStack_3c;
  undefined1 auVar7 [32];
  
  local_98.x = 0x407129e7;
  local_98.y = 0x7888093c;
  local_98.z = 0x760425e2;
  local_98.w = 0x898677b9;
  local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x3800000);
  pBVar1 = local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
           super__Vector_impl_data._M_start + 0x200000;
  local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pBVar1;
  memset(local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x3800000);
  bVar4 = true;
  bit = 0;
  uStack_68 = 0;
  uStack_64 = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_6c = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar1;
  do {
    printf("Testing bit %d\n",(ulong)bit);
    lVar5 = 0;
    do {
      Rand::rand_p(&local_98,local_80,8);
      (*hash)(local_80,8,0,&local_78);
      flipbit(local_80,8,bit);
      (*hash)(local_80,8,0,&local_58);
      auVar6._8_4_ = uStack_70;
      auVar6._0_8_ = local_78;
      auVar6._12_4_ = uStack_6c;
      auVar6._16_4_ = uStack_68;
      auVar6._20_8_ = uStack_64;
      auVar6._28_4_ = uStack_5c;
      auVar6 = vmovdqu8_avx512vl(auVar6);
      auVar7._0_28_ = auVar6._0_28_;
      auVar7._30_2_ = auVar6._30_2_;
      auVar7._28_2_ = 0;
      auVar2._8_4_ = uStack_50;
      auVar2._0_8_ = local_58;
      auVar2._12_4_ = uStack_4c;
      auVar2._16_4_ = uStack_48;
      auVar2._20_8_ = uStack_44;
      auVar2._28_4_ = uStack_3c;
      auVar6 = vmovdqu8_avx512vl(auVar2);
      auVar8._0_28_ = auVar6._0_28_;
      auVar8._30_2_ = auVar6._30_2_;
      auVar8._28_2_ = 0;
      local_b8 = vmovdqu8_avx512vl(auVar8 ^ auVar7);
      *(undefined8 *)
       ((local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
         super__Vector_impl_data._M_start)->bytes + lVar5 + 0xc) = local_b8._12_8_;
      *(undefined8 *)
       ((local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
         super__Vector_impl_data._M_start)->bytes + lVar5 + 0xc + 8) = local_b8._20_8_;
      *(undefined8 *)
       ((local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
         super__Vector_impl_data._M_start)->bytes + lVar5) = local_b8._0_8_;
      *(undefined8 *)
       ((local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
         super__Vector_impl_data._M_start)->bytes + lVar5 + 8) = local_b8._8_8_;
      lVar5 = lVar5 + 0x1c;
    } while (lVar5 != 0x3800000);
    bVar3 = TestHashList<Blob<224>>(&local_d0,true,true,drawDiagram,true,true);
    bVar4 = (bool)(bVar4 & bVar3);
    putchar(10);
    bit = bit + 1;
  } while (bit != 0x40);
  if (local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}